

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::update(Texture *this,Window *window,uint x,uint y)

{
  bool bVar1;
  Vector2u VVar2;
  Vector2u VVar3;
  Uint64 UVar4;
  TransientContextLock lock;
  TextureSaver save;
  
  VVar2 = Window::getSize(window);
  if ((this->m_size).x < VVar2.x + x) {
    __assert_fail("x + window.getSize().x <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x23c,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
  }
  VVar2 = Window::getSize(window);
  if (VVar2.y + y <= (this->m_size).y) {
    if (this->m_texture != 0) {
      bVar1 = Window::setActive(window,true);
      if (bVar1) {
        GlResource::TransientContextLock::TransientContextLock(&lock);
        priv::TextureSaver::TextureSaver(&save);
        glBindTexture(0xde1,this->m_texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x247,"glBindTexture(GL_TEXTURE_2D, m_texture)");
        VVar2 = Window::getSize(window);
        VVar3 = Window::getSize(window);
        glCopyTexSubImage2D(0xde1,0,x,y,0,0,VVar2,(ulong)VVar3 >> 0x20);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x248,
                           "glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y)"
                          );
        glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x249,
                           "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                          );
        this->m_hasMipmap = false;
        this->m_pixelsFlipped = true;
        UVar4 = anon_unknown.dwarf_f2021::getUniqueId();
        this->m_cacheId = UVar4;
        glFlush();
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x250,"glFlush()");
        priv::TextureSaver::~TextureSaver(&save);
        GlResource::TransientContextLock::~TransientContextLock(&lock);
      }
    }
    return;
  }
  __assert_fail("y + window.getSize().y <= m_size.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                ,0x23d,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
}

Assistant:

void Texture::update(const Window& window, unsigned int x, unsigned int y)
{
    assert(x + window.getSize().x <= m_size.x);
    assert(y + window.getSize().y <= m_size.y);

    if (m_texture && window.setActive(true))
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the back-buffer to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = true;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}